

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall QPDFJob::addAttachments(QPDFJob *this,QPDF *pdf)

{
  string *fullpath;
  pointer pbVar1;
  _func_int **pp_Var2;
  QPDFEFStreamObjectHelper *this_00;
  runtime_error *this_01;
  iterator __begin2;
  pointer pbVar3;
  iterator __end2;
  list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *plVar4;
  list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> *plVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicated_keys;
  QPDFFileSpecObjectHelper fs;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  QPDFEmbeddedFileDocumentHelper efdh;
  string local_88;
  QPDFEFStreamObjectHelper efs;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fs,"/UseAttachments",(allocator<char> *)&efs);
  maybe_set_pagemode(pdf,(string *)&fs);
  std::__cxx11::string::~string((string *)&fs);
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper(&efdh,pdf);
  duplicated_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  duplicated_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  duplicated_keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  plVar4 = &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            attachments_to_add;
  plVar5 = plVar4;
LAB_0016b681:
  do {
    pbVar1 = duplicated_keys.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    plVar5 = *(list<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_> **)
              &(plVar5->
               super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>).
               _M_impl._M_node.super__List_node_base;
    if (plVar5 == plVar4) {
      if (duplicated_keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          duplicated_keys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&duplicated_keys);
        QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper(&efdh);
        return;
      }
      fs.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
           (_func_int **)
           &fs.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      fs.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      fs.super_QPDFObjectHelper.super_BaseHandle.obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ = 0;
      for (pbVar3 = duplicated_keys.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1
          ) {
        if (fs.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0
           ) {
          std::__cxx11::string::append((char *)&fs);
        }
        std::__cxx11::string::append((string *)&fs);
      }
      QPDF::getFilename_abi_cxx11_(&local_88,pdf);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x10),&local_88,
                     " already has attachments with the following keys: ");
      std::operator+(&local_f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_d8 + 0x10),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&efs,
                     &local_f8,"; use --replace to replace or --key to specify a different key");
      std::__cxx11::string::operator=((string *)&fs,(string *)&efs);
      std::__cxx11::string::~string((string *)&efs);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)(local_d8 + 0x10));
      std::__cxx11::string::~string((string *)&local_88);
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,(string *)&fs);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (*(char *)&(((vector<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_> *)
                   (plVar5 + 10))->
                  super__Vector_base<QPDFJob::UnderOverlay,_std::allocator<QPDFJob::UnderOverlay>_>)
                  ._M_impl.super__Vector_impl_data._M_start == '\0') {
      QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
                ((QPDFEmbeddedFileDocumentHelper *)&fs,(string *)&efdh);
      pp_Var2 = fs.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &fs.super_QPDFObjectHelper.super_BaseHandle);
      if (pp_Var2 != (_func_int **)0x0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&duplicated_keys,(value_type *)(plVar5 + 2));
        goto LAB_0016b681;
      }
    }
    fullpath = (string *)
               &(plVar5->
                super__List_base<QPDFJob::AddAttachment,_std::allocator<QPDFJob::AddAttachment>_>).
                _M_impl._M_node._M_size;
    QPDFFileSpecObjectHelper::createFileSpec(&fs,pdf,(string *)((long)(plVar5 + 3) + 8),fullpath);
    if (*(size_t *)(plVar5 + 9) != 0) {
      QPDFFileSpecObjectHelper::setDescription(&fs,(string *)((long)(plVar5 + 8) + 0x10));
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"",(allocator<char> *)(local_d8 + 0x10));
    QPDFFileSpecObjectHelper::getEmbeddedFileStream
              ((QPDFFileSpecObjectHelper *)local_d8,(string *)&fs);
    QPDFEFStreamObjectHelper::QPDFEFStreamObjectHelper(&efs,(QPDFObjectHandle *)local_d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d8 + 8));
    std::__cxx11::string::~string((string *)&local_f8);
    this_00 = QPDFEFStreamObjectHelper::setCreationDate(&efs,(string *)((long)(plVar5 + 4) + 0x10));
    QPDFEFStreamObjectHelper::setModDate(this_00,(string *)(plVar5 + 6));
    if (*(long *)((long)(plVar5 + 7) + 0x10) != 0) {
      QPDFEFStreamObjectHelper::setSubtype(&efs,(string *)((long)(plVar5 + 7) + 8));
    }
    QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile(&efdh,(string *)(plVar5 + 2),&fs);
    local_118._8_8_ = 0;
    local_100 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2111:21)>
                ::_M_invoke;
    local_108 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2111:21)>
                ::_M_manager;
    local_118._M_unused._M_object = fullpath;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&local_118);
    QPDFEFStreamObjectHelper::~QPDFEFStreamObjectHelper(&efs);
    QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper(&fs);
  } while( true );
}

Assistant:

void
QPDFJob::addAttachments(QPDF& pdf)
{
    maybe_set_pagemode(pdf, "/UseAttachments");
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    std::vector<std::string> duplicated_keys;
    for (auto const& to_add: m->attachments_to_add) {
        if ((!to_add.replace) && efdh.getEmbeddedFile(to_add.key)) {
            duplicated_keys.push_back(to_add.key);
            continue;
        }

        auto fs = QPDFFileSpecObjectHelper::createFileSpec(pdf, to_add.filename, to_add.path);
        if (!to_add.description.empty()) {
            fs.setDescription(to_add.description);
        }
        auto efs = QPDFEFStreamObjectHelper(fs.getEmbeddedFileStream());
        efs.setCreationDate(to_add.creationdate).setModDate(to_add.moddate);
        if (!to_add.mimetype.empty()) {
            efs.setSubtype(to_add.mimetype);
        }

        efdh.replaceEmbeddedFile(to_add.key, fs);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": attached " << to_add.path << " as " << to_add.filename << " with key "
              << to_add.key << "\n";
        });
    }

    if (!duplicated_keys.empty()) {
        std::string message;
        for (auto const& k: duplicated_keys) {
            if (!message.empty()) {
                message += ", ";
            }
            message += k;
        }
        message = pdf.getFilename() +
            " already has attachments with the following keys: " + message +
            "; use --replace to replace or --key to specify a different key";
        throw std::runtime_error(message);
    }
}